

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall QPDFArgParser::handleArgFileArguments(QPDFArgParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  size_t sVar5;
  element_type *peVar6;
  pointer psVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong i;
  char *__s;
  allocator<char> local_79;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  string local_68;
  shared_ptr<const_char> local_48;
  
  peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,*peVar6->argv,&local_79);
  QUtil::make_shared_cstr((QUtil *)&local_78,&local_68);
  local_48.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_48.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_70
  ;
  local_78 = (element_type *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
  emplace_back<std::shared_ptr<char_const>>
            ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>> *)
             &peVar6->new_argv,&local_48);
  if (local_48.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (1 < peVar6->argc) {
    lVar10 = 1;
    do {
      __s = peVar6->argv[lVar10];
      sVar5 = strlen(__s);
      if ((sVar5 < 2) || (*__s != '@')) {
LAB_0016058f:
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_79);
        QUtil::make_shared_cstr((QUtil *)&local_78,&local_68);
        local_48.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
        local_48.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Stack_70;
        local_78 = (element_type *)0x0;
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
        emplace_back<std::shared_ptr<char_const>>
                  ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>
                    *)&peVar6->new_argv,&local_48);
        if (local_48.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
        }
      }
      else {
        if ((__s[1] != '-') || (__s[2] != '\0')) {
          bVar4 = QUtil::file_can_be_opened(__s + 1);
          peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          __s = peVar6->argv[lVar10];
          if (!bVar4) goto LAB_0016058f;
        }
        local_68._M_dataplus._M_p = (pointer)paVar1;
        sVar5 = strlen(__s + 1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s + 1,__s + sVar5 + 1)
        ;
        readArgsFromFile(this,&local_68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      lVar10 = lVar10 + 1;
      peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    } while (lVar10 < peVar6->argc);
  }
  lVar10 = (long)*(pointer *)
                  ((long)&(peVar6->new_argv).
                          super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                          ._M_impl.super__Vector_impl_data + 8) -
           (long)(peVar6->new_argv).
                 super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_68._M_dataplus._M_p =
       (pointer)operator_new__(-(ulong)(lVar10 + 1U >> 0x3d != 0) | lVar10 * 8 + 8U);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<char_const**,std::default_delete<char_const*[]>,std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
  sVar3 = local_68._M_string_length;
  _Var2._M_p = local_68._M_dataplus._M_p;
  peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  this_00 = (peVar6->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (peVar6->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var2._M_p;
  (peVar6->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
    }
  }
  peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar7 = (peVar6->new_argv).
           super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(peVar6->new_argv).
               super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
               ._M_impl.super__Vector_impl_data + 8) == psVar7) {
    i = 0;
    lVar10 = 0;
  }
  else {
    lVar10 = 0;
    uVar8 = 0;
    do {
      (peVar6->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr[uVar8] =
           *(element_type *)
            ((long)&(psVar7->super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
            lVar10);
      uVar8 = uVar8 + 1;
      peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      psVar7 = (peVar6->new_argv).
               super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = (long)*(pointer *)
                     ((long)&(peVar6->new_argv).
                             super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                             ._M_impl.super__Vector_impl_data + 8) - (long)psVar7;
      i = (long)uVar9 >> 4;
      lVar10 = lVar10 + 0x10;
    } while (uVar8 < i);
    lVar10 = (long)(int)(uVar9 >> 4);
  }
  if (i >> 0x1f != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
  }
  peVar6->argc = (int)i;
  (peVar6->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr[lVar10] =
       (element_type)0x0;
  peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar6->argv = (peVar6->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  return;
}

Assistant:

void
QPDFArgParser::handleArgFileArguments()
{
    // Support reading arguments from files. Create a new argv. Ensure that argv itself as well as
    // all its contents are automatically deleted by using shared pointers back to the pointers in
    // argv.
    m->new_argv.push_back(QUtil::make_shared_cstr(m->argv[0]));
    for (int i = 1; i < m->argc; ++i) {
        char const* argfile = nullptr;
        if ((strlen(m->argv[i]) > 1) && (m->argv[i][0] == '@')) {
            argfile = 1 + m->argv[i];
            if (strcmp(argfile, "-") != 0) {
                if (!QUtil::file_can_be_opened(argfile)) {
                    // The file's not there; treating as regular option
                    argfile = nullptr;
                }
            }
        }
        if (argfile) {
            readArgsFromFile(1 + m->argv[i]);
        } else {
            m->new_argv.push_back(QUtil::make_shared_cstr(m->argv[i]));
        }
    }
    m->argv_ph = QUtil::make_shared_array<char const*>(1 + m->new_argv.size());
    for (size_t i = 0; i < m->new_argv.size(); ++i) {
        m->argv_ph.get()[i] = m->new_argv.at(i).get();
    }
    m->argc = QIntC::to_int(m->new_argv.size());
    m->argv_ph.get()[m->argc] = nullptr;
    m->argv = m->argv_ph.get();
}